

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)4>::
dispatch<true,TI::TMS::CharacterSequencer<(TI::TMS::Personality)4>>
          (Base<(TI::TMS::Personality)4> *this,CharacterSequencer<(TI::TMS::Personality)4> *fetcher,
          int start,int end)

{
  Base<(TI::TMS::Personality)4> *pBVar1;
  
  switch(start) {
  case 0:
    do_external_slot((fetcher->character_fetcher).base,0);
    if (end == 1) {
      return;
    }
  case 1:
    do_external_slot((fetcher->character_fetcher).base,2);
    if (end == 2) {
      return;
    }
switchD_001a7c26_caseD_2:
    do_external_slot((fetcher->character_fetcher).base,4);
    if (end == 3) {
      return;
    }
switchD_001a7c26_caseD_3:
    do_external_slot((fetcher->character_fetcher).base,6);
    if (end == 4) {
      return;
    }
switchD_001a7c26_caseD_4:
    do_external_slot((fetcher->character_fetcher).base,8);
    if (end == 5) {
      return;
    }
switchD_001a7c26_caseD_5:
    CharacterSequencer<(TI::TMS::Personality)4>::fetch<5>(fetcher);
    if (end - 6U < 10) {
      return;
    }
    break;
  case 2:
    goto switchD_001a7c26_caseD_2;
  case 3:
    goto switchD_001a7c26_caseD_3;
  case 4:
    goto switchD_001a7c26_caseD_4;
  case 5:
    goto switchD_001a7c26_caseD_5;
  case 6:
    if (end - 7U < 9) {
      return;
    }
    break;
  case 7:
    if ((end & 0xfffffff8U) == 8) {
      return;
    }
    break;
  case 8:
    if (end - 9U < 7) {
      return;
    }
    break;
  case 9:
    if (end - 10U < 6) {
      return;
    }
    break;
  case 10:
    if (end - 0xbU < 5) {
      return;
    }
    break;
  case 0xb:
    if ((end & 0xfffffffcU) == 0xc) {
      return;
    }
    break;
  case 0xc:
    if (end - 0xdU < 3) {
      return;
    }
    break;
  case 0xd:
    if ((end & 0xfffffffeU) == 0xe) {
      return;
    }
    break;
  case 0xe:
    if (end == 0xf) {
      return;
    }
    break;
  case 0xf:
    break;
  case 0x10:
    goto switchD_001a7c26_caseD_10;
  case 0x11:
    goto switchD_001a7c26_caseD_11;
  case 0x12:
    goto switchD_001a7c26_caseD_12;
  case 0x13:
    goto switchD_001a7c26_caseD_13;
  case 0x14:
    if (end - 0x15U < 7) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x15:
    if (end - 0x16U < 6) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x16:
    if (end - 0x17U < 5) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x17:
    if ((end & 0xfffffffcU) == 0x18) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x18:
    if (end - 0x19U < 3) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x19:
    if ((end & 0xfffffffeU) == 0x1a) {
      return;
    }
    goto switchD_001a7c26_caseD_1b;
  case 0x1a:
    if (end == 0x1b) {
      return;
    }
  case 0x1b:
    goto switchD_001a7c26_caseD_1b;
  case 0x1c:
    goto switchD_001a7c26_caseD_1c;
  case 0x1d:
    goto switchD_001a7c26_caseD_1d;
  case 0x1e:
    if (end == 0x1f) {
      return;
    }
  case 0x1f:
    goto switchD_001a7c26_caseD_1f;
  case 0x20:
    goto switchD_001a7c26_caseD_20;
  case 0x21:
    goto switchD_001a7c26_caseD_21;
  case 0x22:
    if (end == 0x23) {
      return;
    }
  case 0x23:
    goto switchD_001a7c26_caseD_23;
  case 0x24:
    goto switchD_001a7c26_caseD_24;
  case 0x25:
    goto switchD_001a7c26_caseD_25;
  case 0x26:
    if (end == 0x27) {
      return;
    }
  case 0x27:
    goto switchD_001a7c26_caseD_27;
  case 0x28:
    goto switchD_001a7c26_caseD_28;
  case 0x29:
    goto switchD_001a7c26_caseD_29;
  case 0x2a:
    if (end == 0x2b) {
      return;
    }
  case 0x2b:
    goto switchD_001a7c26_caseD_2b;
  case 0x2c:
    goto switchD_001a7c26_caseD_2c;
  case 0x2d:
    goto switchD_001a7c26_caseD_2d;
  case 0x2e:
    if (end == 0x2f) {
      return;
    }
  case 0x2f:
    goto switchD_001a7c26_caseD_2f;
  case 0x30:
    goto switchD_001a7c26_caseD_30;
  case 0x31:
    goto switchD_001a7c26_caseD_31;
  case 0x32:
    if (end == 0x33) {
      return;
    }
  case 0x33:
    goto switchD_001a7c26_caseD_33;
  case 0x34:
    goto switchD_001a7c26_caseD_34;
  case 0x35:
    goto switchD_001a7c26_caseD_35;
  case 0x36:
    if (end == 0x37) {
      return;
    }
  case 0x37:
    goto switchD_001a7c26_caseD_37;
  case 0x38:
    goto switchD_001a7c26_caseD_38;
  case 0x39:
    goto switchD_001a7c26_caseD_39;
  case 0x3a:
    if (end == 0x3b) {
      return;
    }
  case 0x3b:
    goto switchD_001a7c26_caseD_3b;
  case 0x3c:
    goto switchD_001a7c26_caseD_3c;
  case 0x3d:
    goto switchD_001a7c26_caseD_3d;
  case 0x3e:
    if (end == 0x3f) {
      return;
    }
  case 0x3f:
    goto switchD_001a7c26_caseD_3f;
  case 0x40:
    goto switchD_001a7c26_caseD_40;
  case 0x41:
    goto switchD_001a7c26_caseD_41;
  case 0x42:
    if (end == 0x43) {
      return;
    }
  case 0x43:
    goto switchD_001a7c26_caseD_43;
  case 0x44:
    goto switchD_001a7c26_caseD_44;
  case 0x45:
    goto switchD_001a7c26_caseD_45;
  case 0x46:
    if (end == 0x47) {
      return;
    }
  case 0x47:
    goto switchD_001a7c26_caseD_47;
  case 0x48:
    goto switchD_001a7c26_caseD_48;
  case 0x49:
    goto switchD_001a7c26_caseD_49;
  case 0x4a:
    if (end == 0x4b) {
      return;
    }
  case 0x4b:
    goto switchD_001a7c26_caseD_4b;
  case 0x4c:
    goto switchD_001a7c26_caseD_4c;
  case 0x4d:
    goto switchD_001a7c26_caseD_4d;
  case 0x4e:
    if (end == 0x4f) {
      return;
    }
  case 0x4f:
    goto switchD_001a7c26_caseD_4f;
  case 0x50:
    goto switchD_001a7c26_caseD_50;
  case 0x51:
    goto switchD_001a7c26_caseD_51;
  case 0x52:
    if (end == 0x53) {
      return;
    }
  case 0x53:
    goto switchD_001a7c26_caseD_53;
  case 0x54:
    goto switchD_001a7c26_caseD_54;
  case 0x55:
    goto switchD_001a7c26_caseD_55;
  case 0x56:
    if (end == 0x57) {
      return;
    }
  case 0x57:
    goto switchD_001a7c26_caseD_57;
  case 0x58:
    goto switchD_001a7c26_caseD_58;
  case 0x59:
    goto switchD_001a7c26_caseD_59;
  case 0x5a:
    if (end == 0x5b) {
      return;
    }
  case 0x5b:
    goto switchD_001a7c26_caseD_5b;
  case 0x5c:
    goto switchD_001a7c26_caseD_5c;
  case 0x5d:
    goto switchD_001a7c26_caseD_5d;
  case 0x5e:
    if (end == 0x5f) {
      return;
    }
  case 0x5f:
    goto switchD_001a7c26_caseD_5f;
  case 0x60:
    goto switchD_001a7c26_caseD_60;
  case 0x61:
    goto switchD_001a7c26_caseD_61;
  case 0x62:
    if (end == 99) {
      return;
    }
  case 99:
    goto switchD_001a7c26_caseD_63;
  case 100:
    goto switchD_001a7c26_caseD_64;
  case 0x65:
    goto switchD_001a7c26_caseD_65;
  case 0x66:
    if (end == 0x67) {
      return;
    }
  case 0x67:
    goto switchD_001a7c26_caseD_67;
  case 0x68:
    goto switchD_001a7c26_caseD_68;
  case 0x69:
    goto switchD_001a7c26_caseD_69;
  case 0x6a:
    if (end == 0x6b) {
      return;
    }
  case 0x6b:
    goto switchD_001a7c26_caseD_6b;
  case 0x6c:
    goto switchD_001a7c26_caseD_6c;
  case 0x6d:
    goto switchD_001a7c26_caseD_6d;
  case 0x6e:
    if (end == 0x6f) {
      return;
    }
  case 0x6f:
    goto switchD_001a7c26_caseD_6f;
  case 0x70:
    goto switchD_001a7c26_caseD_70;
  case 0x71:
    goto switchD_001a7c26_caseD_71;
  case 0x72:
    if (end == 0x73) {
      return;
    }
  case 0x73:
    goto switchD_001a7c26_caseD_73;
  case 0x74:
    goto switchD_001a7c26_caseD_74;
  case 0x75:
    goto switchD_001a7c26_caseD_75;
  case 0x76:
    if (end == 0x77) {
      return;
    }
  case 0x77:
    goto switchD_001a7c26_caseD_77;
  case 0x78:
    goto switchD_001a7c26_caseD_78;
  case 0x79:
    goto switchD_001a7c26_caseD_79;
  case 0x7a:
    if (end == 0x7b) {
      return;
    }
  case 0x7b:
    goto switchD_001a7c26_caseD_7b;
  case 0x7c:
    goto switchD_001a7c26_caseD_7c;
  case 0x7d:
    goto switchD_001a7c26_caseD_7d;
  case 0x7e:
    if (end == 0x7f) {
      return;
    }
  case 0x7f:
    goto switchD_001a7c26_caseD_7f;
  case 0x80:
    goto switchD_001a7c26_caseD_80;
  case 0x81:
    goto switchD_001a7c26_caseD_81;
  case 0x82:
    if (end == 0x83) {
      return;
    }
  case 0x83:
    goto switchD_001a7c26_caseD_83;
  case 0x84:
    goto switchD_001a7c26_caseD_84;
  case 0x85:
    goto switchD_001a7c26_caseD_85;
  case 0x86:
    if (end == 0x87) {
      return;
    }
  case 0x87:
    goto switchD_001a7c26_caseD_87;
  case 0x88:
    goto switchD_001a7c26_caseD_88;
  case 0x89:
    goto switchD_001a7c26_caseD_89;
  case 0x8a:
    if (end == 0x8b) {
      return;
    }
  case 0x8b:
    goto switchD_001a7c26_caseD_8b;
  case 0x8c:
    goto switchD_001a7c26_caseD_8c;
  case 0x8d:
    goto switchD_001a7c26_caseD_8d;
  case 0x8e:
    if (end == 0x8f) {
      return;
    }
  case 0x8f:
    goto switchD_001a7c26_caseD_8f;
  case 0x90:
    goto switchD_001a7c26_caseD_90;
  case 0x91:
    goto switchD_001a7c26_caseD_91;
  case 0x92:
    if (end == 0x93) {
      return;
    }
  case 0x93:
    goto switchD_001a7c26_caseD_93;
  case 0x94:
    goto switchD_001a7c26_caseD_94;
  case 0x95:
    goto switchD_001a7c26_caseD_95;
  case 0x96:
    if (end == 0x97) {
      return;
    }
  case 0x97:
    goto switchD_001a7c26_caseD_97;
  case 0x98:
    goto switchD_001a7c26_caseD_98;
  case 0x99:
    goto switchD_001a7c26_caseD_99;
  case 0x9a:
    if (end == 0x9b) {
      return;
    }
  case 0x9b:
    goto switchD_001a7c26_caseD_9b;
  case 0x9c:
    goto switchD_001a7c26_caseD_9c;
  case 0x9d:
    goto switchD_001a7c26_caseD_9d;
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
    goto switchD_001a7c26_caseD_9e;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMS2VDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMS2VDP, use_end = true, Fetcher = TI::TMS::CharacterSequencer<TI::TMS::SMS2VDP>]"
                 );
  }
  do_external_slot((fetcher->character_fetcher).base,0x1e);
  if (end != 0x10) {
switchD_001a7c26_caseD_10:
    do_external_slot((fetcher->character_fetcher).base,0x20);
    if (end != 0x11) {
switchD_001a7c26_caseD_11:
      do_external_slot((fetcher->character_fetcher).base,0x22);
      if (end != 0x12) {
switchD_001a7c26_caseD_12:
        do_external_slot((fetcher->character_fetcher).base,0x24);
        if (end != 0x13) {
switchD_001a7c26_caseD_13:
          CharacterSequencer<(TI::TMS::Personality)4>::fetch<19>(fetcher);
          if (7 < end - 0x14U) {
switchD_001a7c26_caseD_1b:
            pBVar1 = (fetcher->character_fetcher).base;
            pBVar1->tile_offset_ =
                 (ushort)(pBVar1->ram_)._M_elems[(fetcher->character_fetcher).row_base];
            if (end != 0x1c) {
switchD_001a7c26_caseD_1c:
              do_external_slot((fetcher->character_fetcher).base,0x38);
              if (end != 0x1d) {
switchD_001a7c26_caseD_1d:
                CharacterSequencer<(TI::TMS::Personality)4>::fetch<29>(fetcher);
                if ((end & 0xfffffffeU) != 0x1e) {
switchD_001a7c26_caseD_1f:
                  pBVar1 = (fetcher->character_fetcher).base;
                  pBVar1->tile_offset_ =
                       (ushort)(pBVar1->ram_)._M_elems
                               [(ulong)(fetcher->character_fetcher).row_base + 1];
                  if (end != 0x20) {
switchD_001a7c26_caseD_20:
                    CharacterSequencer<(TI::TMS::Personality)4>::fetch<32>(fetcher);
                    if (end != 0x21) {
switchD_001a7c26_caseD_21:
                      CharacterSequencer<(TI::TMS::Personality)4>::fetch<33>(fetcher);
                      if ((end & 0xfffffffeU) != 0x22) {
switchD_001a7c26_caseD_23:
                        pBVar1 = (fetcher->character_fetcher).base;
                        pBVar1->tile_offset_ =
                             (ushort)(pBVar1->ram_)._M_elems
                                     [(ulong)(fetcher->character_fetcher).row_base + 2];
                        if (end != 0x24) {
switchD_001a7c26_caseD_24:
                          CharacterSequencer<(TI::TMS::Personality)4>::fetch<36>(fetcher);
                          if (end != 0x25) {
switchD_001a7c26_caseD_25:
                            CharacterSequencer<(TI::TMS::Personality)4>::fetch<37>(fetcher);
                            if ((end & 0xfffffffeU) != 0x26) {
switchD_001a7c26_caseD_27:
                              pBVar1 = (fetcher->character_fetcher).base;
                              pBVar1->tile_offset_ =
                                   (ushort)(pBVar1->ram_)._M_elems
                                           [(ulong)(fetcher->character_fetcher).row_base + 3];
                              if (end != 0x28) {
switchD_001a7c26_caseD_28:
                                CharacterSequencer<(TI::TMS::Personality)4>::fetch<40>(fetcher);
                                if (end != 0x29) {
switchD_001a7c26_caseD_29:
                                  CharacterSequencer<(TI::TMS::Personality)4>::fetch<41>(fetcher);
                                  if ((end & 0xfffffffeU) != 0x2a) {
switchD_001a7c26_caseD_2b:
                                    pBVar1 = (fetcher->character_fetcher).base;
                                    pBVar1->tile_offset_ =
                                         (ushort)(pBVar1->ram_)._M_elems
                                                 [(ulong)(fetcher->character_fetcher).row_base + 4];
                                    if (end != 0x2c) {
switchD_001a7c26_caseD_2c:
                                      do_external_slot((fetcher->character_fetcher).base,0x58);
                                      if (end != 0x2d) {
switchD_001a7c26_caseD_2d:
                                        CharacterSequencer<(TI::TMS::Personality)4>::fetch<45>
                                                  (fetcher);
                                        if ((end & 0xfffffffeU) != 0x2e) {
switchD_001a7c26_caseD_2f:
                                          pBVar1 = (fetcher->character_fetcher).base;
                                          pBVar1->tile_offset_ =
                                               (ushort)(pBVar1->ram_)._M_elems
                                                       [(ulong)(fetcher->character_fetcher).row_base
                                                        + 5];
                                          if (end != 0x30) {
switchD_001a7c26_caseD_30:
                                            CharacterSequencer<(TI::TMS::Personality)4>::fetch<48>
                                                      (fetcher);
                                            if (end != 0x31) {
switchD_001a7c26_caseD_31:
                                              CharacterSequencer<(TI::TMS::Personality)4>::fetch<49>
                                                        (fetcher);
                                              if ((end & 0xfffffffeU) != 0x32) {
switchD_001a7c26_caseD_33:
                                                pBVar1 = (fetcher->character_fetcher).base;
                                                pBVar1->tile_offset_ =
                                                     (ushort)(pBVar1->ram_)._M_elems
                                                             [(ulong)(fetcher->character_fetcher).
                                                                     row_base + 6];
                                                if (end != 0x34) {
switchD_001a7c26_caseD_34:
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<52>(fetcher);
                                                  if (end != 0x35) {
switchD_001a7c26_caseD_35:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<53>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x36) {
switchD_001a7c26_caseD_37:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 7];
                                                      if (end != 0x38) {
switchD_001a7c26_caseD_38:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<56>(fetcher);
                                                        if (end != 0x39) {
switchD_001a7c26_caseD_39:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<57>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x3a) {
switchD_001a7c26_caseD_3b:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 8];
                                                    if (end != 0x3c) {
switchD_001a7c26_caseD_3c:
                                                      do_external_slot((fetcher->character_fetcher).
                                                                       base,0x78);
                                                      if (end != 0x3d) {
switchD_001a7c26_caseD_3d:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<61>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x3e) {
switchD_001a7c26_caseD_3f:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 9];
                                                          if (end != 0x40) {
switchD_001a7c26_caseD_40:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<64>(fetcher);
                                                  if (end != 0x41) {
switchD_001a7c26_caseD_41:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<65>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x42) {
switchD_001a7c26_caseD_43:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 10];
                                                      if (end != 0x44) {
switchD_001a7c26_caseD_44:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<68>(fetcher);
                                                        if (end != 0x45) {
switchD_001a7c26_caseD_45:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<69>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x46) {
switchD_001a7c26_caseD_47:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0xb];
                                                    if (end != 0x48) {
switchD_001a7c26_caseD_48:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<72>(fetcher);
                                                      if (end != 0x49) {
switchD_001a7c26_caseD_49:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<73>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x4a) {
switchD_001a7c26_caseD_4b:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0xc];
                                                          if (end != 0x4c) {
switchD_001a7c26_caseD_4c:
                                                            do_external_slot((fetcher->
                                                                             character_fetcher).base
                                                                             ,0x98);
                                                            if (end != 0x4d) {
switchD_001a7c26_caseD_4d:
                                                                                                                            
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<77>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x4e) {
switchD_001a7c26_caseD_4f:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0xd];
                                                    if (end != 0x50) {
switchD_001a7c26_caseD_50:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<80>(fetcher);
                                                      if (end != 0x51) {
switchD_001a7c26_caseD_51:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<81>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x52) {
switchD_001a7c26_caseD_53:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0xe];
                                                          if (end != 0x54) {
switchD_001a7c26_caseD_54:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<84>(fetcher);
                                                  if (end != 0x55) {
switchD_001a7c26_caseD_55:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<85>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x56) {
switchD_001a7c26_caseD_57:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 0xf];
                                                      if (end != 0x58) {
switchD_001a7c26_caseD_58:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<88>(fetcher);
                                                        if (end != 0x59) {
switchD_001a7c26_caseD_59:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<89>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x5a) {
switchD_001a7c26_caseD_5b:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x10];
                                                    if (end != 0x5c) {
switchD_001a7c26_caseD_5c:
                                                      do_external_slot((fetcher->character_fetcher).
                                                                       base,0xb8);
                                                      if (end != 0x5d) {
switchD_001a7c26_caseD_5d:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<93>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x5e) {
switchD_001a7c26_caseD_5f:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x11];
                                                          if (end != 0x60) {
switchD_001a7c26_caseD_60:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<96>(fetcher);
                                                  if (end != 0x61) {
switchD_001a7c26_caseD_61:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<97>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x62) {
switchD_001a7c26_caseD_63:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 0x12];
                                                      if (end != 100) {
switchD_001a7c26_caseD_64:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<100>(fetcher);
                                                        if (end != 0x65) {
switchD_001a7c26_caseD_65:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<101>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x66) {
switchD_001a7c26_caseD_67:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x13];
                                                    if (end != 0x68) {
switchD_001a7c26_caseD_68:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<104>(fetcher);
                                                      if (end != 0x69) {
switchD_001a7c26_caseD_69:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<105>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x6a) {
switchD_001a7c26_caseD_6b:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x14];
                                                          if (end != 0x6c) {
switchD_001a7c26_caseD_6c:
                                                            do_external_slot((fetcher->
                                                                             character_fetcher).base
                                                                             ,0xd8);
                                                            if (end != 0x6d) {
switchD_001a7c26_caseD_6d:
                                                                                                                            
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<109>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x6e) {
switchD_001a7c26_caseD_6f:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x15];
                                                    if (end != 0x70) {
switchD_001a7c26_caseD_70:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<112>(fetcher);
                                                      if (end != 0x71) {
switchD_001a7c26_caseD_71:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<113>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x72) {
switchD_001a7c26_caseD_73:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x16];
                                                          if (end != 0x74) {
switchD_001a7c26_caseD_74:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<116>(fetcher);
                                                  if (end != 0x75) {
switchD_001a7c26_caseD_75:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<117>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x76) {
switchD_001a7c26_caseD_77:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 0x17];
                                                      if (end != 0x78) {
switchD_001a7c26_caseD_78:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<120>(fetcher);
                                                        if (end != 0x79) {
switchD_001a7c26_caseD_79:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<121>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x7a) {
switchD_001a7c26_caseD_7b:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x18];
                                                    if (end != 0x7c) {
switchD_001a7c26_caseD_7c:
                                                      do_external_slot((fetcher->character_fetcher).
                                                                       base,0xf8);
                                                      if (end != 0x7d) {
switchD_001a7c26_caseD_7d:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<125>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x7e) {
switchD_001a7c26_caseD_7f:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x19];
                                                          if (end != 0x80) {
switchD_001a7c26_caseD_80:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<128>(fetcher);
                                                  if (end != 0x81) {
switchD_001a7c26_caseD_81:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<129>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x82) {
switchD_001a7c26_caseD_83:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 0x1a];
                                                      if (end != 0x84) {
switchD_001a7c26_caseD_84:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<132>(fetcher);
                                                        if (end != 0x85) {
switchD_001a7c26_caseD_85:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<133>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x86) {
switchD_001a7c26_caseD_87:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x1b];
                                                    if (end != 0x88) {
switchD_001a7c26_caseD_88:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<136>(fetcher);
                                                      if (end != 0x89) {
switchD_001a7c26_caseD_89:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<137>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x8a) {
switchD_001a7c26_caseD_8b:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x1c];
                                                          if (end != 0x8c) {
switchD_001a7c26_caseD_8c:
                                                            do_external_slot((fetcher->
                                                                             character_fetcher).base
                                                                             ,0x118);
                                                            if (end != 0x8d) {
switchD_001a7c26_caseD_8d:
                                                                                                                            
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<141>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x8e) {
switchD_001a7c26_caseD_8f:
                                                    pBVar1 = (fetcher->character_fetcher).base;
                                                    pBVar1->tile_offset_ =
                                                         (ushort)(pBVar1->ram_)._M_elems
                                                                 [(ulong)(fetcher->character_fetcher
                                                                         ).row_base + 0x1d];
                                                    if (end != 0x90) {
switchD_001a7c26_caseD_90:
                                                      CharacterSequencer<(TI::TMS::Personality)4>::
                                                      fetch<144>(fetcher);
                                                      if (end != 0x91) {
switchD_001a7c26_caseD_91:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<145>(fetcher);
                                                        if ((end & 0xfffffffeU) != 0x92) {
switchD_001a7c26_caseD_93:
                                                          pBVar1 = (fetcher->character_fetcher).base
                                                          ;
                                                          pBVar1->tile_offset_ =
                                                               (ushort)(pBVar1->ram_)._M_elems
                                                                       [(ulong)(fetcher->
                                                                               character_fetcher).
                                                                               row_base + 0x1e];
                                                          if (end != 0x94) {
switchD_001a7c26_caseD_94:
                                                                                                                        
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<148>(fetcher);
                                                  if (end != 0x95) {
switchD_001a7c26_caseD_95:
                                                    CharacterSequencer<(TI::TMS::Personality)4>::
                                                    fetch<149>(fetcher);
                                                    if ((end & 0xfffffffeU) != 0x96) {
switchD_001a7c26_caseD_97:
                                                      pBVar1 = (fetcher->character_fetcher).base;
                                                      pBVar1->tile_offset_ =
                                                           (ushort)(pBVar1->ram_)._M_elems
                                                                   [(ulong)(fetcher->
                                                                           character_fetcher).
                                                                           row_base + 0x1f];
                                                      if (end != 0x98) {
switchD_001a7c26_caseD_98:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<152>(fetcher);
                                                        if (end != 0x99) {
switchD_001a7c26_caseD_99:
                                                                                                                    
                                                  CharacterSequencer<(TI::TMS::Personality)4>::
                                                  fetch<153>(fetcher);
                                                  if ((end & 0xfffffffeU) != 0x9a) {
switchD_001a7c26_caseD_9b:
                                                    do_external_slot((fetcher->character_fetcher).
                                                                     base,0x136);
                                                    if (end != 0x9c) {
switchD_001a7c26_caseD_9c:
                                                      do_external_slot((fetcher->character_fetcher).
                                                                       base,0x138);
                                                      if (end != 0x9d) {
switchD_001a7c26_caseD_9d:
                                                        CharacterSequencer<(TI::TMS::Personality)4>
                                                        ::fetch<157>(fetcher);
                                                        return;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
switchD_001a7c26_caseD_9e:
  return;
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}